

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O3

void helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>
               (ValueFederate *fed,basic_value<toml::type_config> *data,Input *objUpdate)

{
  pointer pbVar1;
  bool bVar2;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  array_type *paVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar4;
  enable_if_t<detail::is_exact_toml_type<double,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<double>_&>
  pdVar5;
  value_type *this;
  ValueFederate *pVVar6;
  string_type *psVar7;
  value *element;
  basic_value<toml::type_config> *target;
  pointer pbVar8;
  basic_value<toml::type_config> *target_1;
  string_view info_00;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  string info;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  undefined1 local_250 [16];
  undefined1 local_240 [24];
  undefined1 local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [56];
  region local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [56];
  region local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"flags","");
  local_240._16_8_ = fed;
  local_228._0_8_ = objUpdate;
  local_228._8_8_ = fed;
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>
                (data,&local_208,(basic_value<toml::type_config> *)local_1c8);
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_f8,v);
  if (local_f8[0] != empty) {
    if (local_f8[0] == array) {
      paVar3 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_f8);
      pbVar8 = (paVar3->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (paVar3->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != pbVar1) {
        do {
          v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar8);
          loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e
          ::operator()((anon_class_16_2_5e8ce78e *)local_228,(string *)v);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar1);
      }
    }
    else {
      v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
          toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                    ((basic_value<toml::type_config> *)local_f8);
      loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e::
      operator()((anon_class_16_2_5e8ce78e *)local_228,(string *)v);
    }
  }
  if ((local_208._M_dataplus._M_p + -1)[local_208._M_string_length] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208);
    local_250._8_8_ = 0;
    local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
    local_250._0_8_ = local_240;
    v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                  (data,&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
    if (local_250._8_8_ != 0) {
      v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
          local_250;
      loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e::
      operator()((anon_class_16_2_5e8ce78e *)local_228,(string *)v);
    }
    if ((undefined1 *)local_250._0_8_ != local_240) {
      v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
          (local_240._0_8_ + 1);
      operator_delete((void *)local_250._0_8_,(ulong)v);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_f8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  toml::detail::region::~region(&local_b0);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_1c8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_118);
  toml::detail::region::~region(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1c8._0_8_ = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b8._8_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
       ::_M_invoke;
  local_1b8._0_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
       ::_M_manager;
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e8._8_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
       ::_M_invoke;
  local_e8._0_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
       ::_M_manager;
  local_250._8_8_ = 0;
  local_240._8_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
       ::_M_invoke;
  local_240._0_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
       ::_M_manager;
  local_250._0_8_ = objUpdate;
  processOptions(data,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_1c8,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_f8,(function<void_(int,_int)> *)local_250);
  if ((code *)local_240._0_8_ != (code *)0x0) {
    (*(code *)local_240._0_8_)(local_250,local_250,3);
  }
  if ((code *)local_e8._0_8_ != (code *)0x0) {
    (*(code *)local_e8._0_8_)(local_f8,local_f8,3);
  }
  if ((code *)local_1b8._0_8_ != (code *)0x0) {
    (*(code *)local_1b8._0_8_)(local_1c8,local_1c8,3);
  }
  local_f8._0_8_ = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"alias","");
  local_250._8_8_ = local_240._16_8_;
  local_240._8_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
       ::_M_invoke;
  local_240._0_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
       ::_M_manager;
  local_1c8._8_8_ = 0;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
  local_250._0_8_ = objUpdate;
  local_1c8._0_8_ = local_1b8;
  pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                     (data,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                     );
  if (pbVar4->_M_string_length != 0) {
    if ((code *)local_240._0_8_ == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)local_240._8_8_)(local_250,pbVar4);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if ((code *)local_240._0_8_ != (code *)0x0) {
    (*(code *)local_240._0_8_)(local_250,local_250,3);
  }
  if ((undefined1 *)local_f8._0_8_ != local_e8) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"tolerance","");
  local_f8._0_8_ = (void *)0xbff0000000000000;
  pdVar5 = toml::find_or<double,toml::type_config,std::__cxx11::string>
                     (data,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,(double *)local_f8);
  pVVar6 = (ValueFederate *)*pdVar5;
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    local_240._16_8_ = (ValueFederate *)*pdVar5;
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
    pVVar6 = (ValueFederate *)local_240._16_8_;
  }
  if (0.0 < (double)pVVar6) {
    if (objUpdate->delta <= 0.0 && objUpdate->delta != 0.0) {
      objUpdate->changeDetectionEnabled = true;
    }
    objUpdate->delta = (double)pVVar6;
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"info","");
  bVar2 = toml::basic_value<toml::type_config>::contains(data,(key_type *)local_1c8);
  if (bVar2) {
    this = toml::basic_value<toml::type_config>::at(data,(key_type *)local_1c8);
    fileops::tomlAsString_abi_cxx11_((string *)local_228,(fileops *)this,element);
  }
  else {
    local_228._0_8_ = local_228 + 0x10;
    local_228._8_8_ = (ValueFederate *)0x0;
    local_228[0x10] = '\0';
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if ((ValueFederate *)local_228._8_8_ != (ValueFederate *)0x0) {
    info_00._M_str = (char *)local_228._0_8_;
    info_00._M_len = local_228._8_8_;
    Interface::setInfo(&objUpdate->super_Interface,info_00);
  }
  local_1c8._8_8_ = 0;
  local_1b8._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
       ::_M_invoke;
  local_1b8._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
       ::_M_manager;
  local_1c8._0_8_ = objUpdate;
  loadTags(data,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)local_1c8);
  if ((code *)local_1b8._0_8_ != (code *)0x0) {
    (*(code *)local_1b8._0_8_)(local_1c8,local_1c8,3);
  }
  local_1e8._M_allocated_capacity = (size_type)&local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"targets","");
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c8);
  pVVar6 = (ValueFederate *)
           toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1e8,(basic_value<toml::type_config> *)local_1c8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_f8,(basic_value<toml::type_config> *)pVVar6);
  if (local_f8[0] != empty) {
    if (local_f8[0] == array) {
      paVar3 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_f8);
      pbVar1 = (paVar3->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (paVar3->
                    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
          pbVar8 = pbVar8 + 1) {
        psVar7 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar8);
        pVVar6 = (ValueFederate *)psVar7->_M_string_length;
        target_00._M_str = (psVar7->_M_dataplus)._M_p;
        target_00._M_len = (size_t)pVVar6;
        Input::addPublication(objUpdate,target_00);
      }
    }
    else {
      psVar7 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_f8);
      pVVar6 = (ValueFederate *)psVar7->_M_string_length;
      target_01._M_str = (psVar7->_M_dataplus)._M_p;
      target_01._M_len = (size_t)pVVar6;
      Input::addPublication(objUpdate,target_01);
    }
  }
  if (*(char *)((local_1e8._M_allocated_capacity - 1) + local_1e8._8_8_) == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
    local_250._8_8_ = (ValueFederate *)0x0;
    local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
    local_250._0_8_ = (Input *)local_240;
    pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1e8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_250);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4);
    pVVar6 = (ValueFederate *)local_250._8_8_;
    if ((ValueFederate *)local_250._8_8_ != (ValueFederate *)0x0) {
      target_02._M_str = (char *)local_250._0_8_;
      target_02._M_len = local_250._8_8_;
      Input::addPublication(objUpdate,target_02);
    }
    if ((Input *)local_250._0_8_ != (Input *)local_240) {
      pVVar6 = (ValueFederate *)(local_240._0_8_ + 1);
      operator_delete((void *)local_250._0_8_,(ulong)pVVar6);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_f8,(EVP_PKEY_CTX *)pVVar6);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  toml::detail::region::~region(&local_b0);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_1c8,(EVP_PKEY_CTX *)pVVar6);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_118);
  toml::detail::region::~region(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_allocated_capacity != &local_1d8) {
    operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1);
  }
  if ((Input *)local_228._0_8_ != (Input *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
  }
  return;
}

Assistant:

static void loadOptions(ValueFederate* fed, const Inp& data, Obj& objUpdate)
{
    using fileops::getOrDefault;

    addTargets(data, "flags", [&objUpdate, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a valid flag");
            return;
        }
        objUpdate.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&objUpdate](int32_t option, int32_t value) { objUpdate.setOption(option, value); });

    fileops::callIfMember(data, "alias", [&objUpdate, fed](std::string_view val) {
        fed->addAlias(objUpdate, val);
    });

    auto tol = getOrDefault(data, "tolerance", -1.0);
    if (tol > 0.0) {
        objUpdate.setMinimumChange(tol);
    }
    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        objUpdate.setInfo(info);
    }
    loadTags(data, [&objUpdate](std::string_view tagname, std::string_view tagvalue) {
        objUpdate.setTag(tagname, tagvalue);
    });
    addTargets(data, "targets", [&objUpdate](std::string_view target) {
        objUpdate.addTarget(target);
    });
}